

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O3

void __thiscall QNetworkProxy::setHeaders(QNetworkProxy *this,QHttpHeaders *newHeaders)

{
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  if (((this->d).d.ptr)->type != HttpProxy) {
    QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
    if (((this->d).d.ptr)->type != HttpCachingProxy) {
      return;
    }
  }
  QSharedDataPointer<QNetworkProxyPrivate>::detach(&this->d);
  QNetworkHeadersPrivate::setHeaders(&((this->d).d.ptr)->headers,newHeaders);
  return;
}

Assistant:

void QNetworkProxy::setHeaders(const QHttpHeaders &newHeaders)
{
    if (d->type == HttpProxy || d->type == HttpCachingProxy)
        d->headers.setHeaders(newHeaders);
}